

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3WhereAddLimit(WhereClause *pWC,Select *p)

{
  u8 *puVar1;
  int iCsr;
  SrcList *pSVar2;
  ExprList *pEVar3;
  WhereTerm *pWVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((((p->pGroupBy == (ExprList *)0x0) && ((p->selFlags & 9) == 0)) &&
      (pSVar2 = p->pSrc, pSVar2->nSrc == 1)) && ((pSVar2->a[0].pTab)->eTabType == '\x01')) {
    pEVar3 = p->pOrderBy;
    iCsr = pSVar2->a[0].iCursor;
    uVar6 = 0;
    uVar7 = (ulong)(uint)pWC->nTerm;
    if (pWC->nTerm < 1) {
      uVar7 = uVar6;
    }
    for (; uVar7 * 0x38 - uVar6 != 0; uVar6 = uVar6 + 0x38) {
      pWVar4 = pWC->a;
      if (((*(byte *)((long)&pWVar4->wtFlags + uVar6) & 4) == 0) &&
         ((&pWVar4->nChild)[uVar6] == '\0')) {
        if (*(int *)((long)&pWVar4->leftCursor + uVar6) != iCsr) {
          return;
        }
        if (*(long *)((long)&pWVar4->prereqRight + uVar6) != 0) {
          return;
        }
      }
    }
    if (pEVar3 == (ExprList *)0x0) {
LAB_00178e16:
      if ((p->iOffset == 0) ||
         (((p->selFlags >> 8 & 1) == 0 &&
          ((whereAddLimitExpr(pWC,p->iOffset,p->pLimit->pRight,iCsr,0x4a), p->iOffset == 0 ||
           ((p->selFlags & 0x100) == 0)))))) {
        whereAddLimitExpr(pWC,p->iLimit,p->pLimit->pLeft,iCsr,0x49);
        return;
      }
    }
    else {
      uVar7 = (ulong)(uint)pEVar3->nExpr;
      if (pEVar3->nExpr < 1) {
        uVar7 = 0;
      }
      uVar6 = 0;
      do {
        if (uVar7 * 0x18 + 0x18 == uVar6 + 0x18) goto LAB_00178e16;
        pcVar5 = *(char **)((long)&pEVar3->a[0].pExpr + uVar6);
      } while (((*pcVar5 == -0x59) && (*(int *)(pcVar5 + 0x2c) == iCsr)) &&
              (puVar1 = &pEVar3->a[0].fg.sortFlags + uVar6, uVar6 = uVar6 + 0x18, (*puVar1 & 2) == 0
              ));
    }
  }
  return;
}

Assistant:

SQLITE_NOINLINE sqlite3WhereAddLimit(WhereClause *pWC, Select *p){
  assert( p!=0 && p->pLimit!=0 );                 /* 1 -- checked by caller */
  if( p->pGroupBy==0
   && (p->selFlags & (SF_Distinct|SF_Aggregate))==0             /* 2 */
   && (p->pSrc->nSrc==1 && IsVirtual(p->pSrc->a[0].pTab))       /* 3 */
  ){
    ExprList *pOrderBy = p->pOrderBy;
    int iCsr = p->pSrc->a[0].iCursor;
    int ii;

    /* Check condition (4). Return early if it is not met. */
    for(ii=0; ii<pWC->nTerm; ii++){
      if( pWC->a[ii].wtFlags & TERM_CODED ){
        /* This term is a vector operation that has been decomposed into
        ** other, subsequent terms.  It can be ignored. See tag-20220128a */
        assert( pWC->a[ii].wtFlags & TERM_VIRTUAL );
        assert( pWC->a[ii].eOperator==WO_ROWVAL );
        continue;
      }
      if( pWC->a[ii].nChild ){
        /* If this term has child terms, then they are also part of the
        ** pWC->a[] array. So this term can be ignored, as a LIMIT clause
        ** will only be added if each of the child terms passes the
        ** (leftCursor==iCsr) test below.  */
        continue;
      }
      if( pWC->a[ii].leftCursor!=iCsr ) return;
      if( pWC->a[ii].prereqRight!=0 ) return;
    }

    /* Check condition (5). Return early if it is not met. */
    if( pOrderBy ){
      for(ii=0; ii<pOrderBy->nExpr; ii++){
        Expr *pExpr = pOrderBy->a[ii].pExpr;
        if( pExpr->op!=TK_COLUMN ) return;
        if( pExpr->iTable!=iCsr ) return;
        if( pOrderBy->a[ii].fg.sortFlags & KEYINFO_ORDER_BIGNULL ) return;
      }
    }

    /* All conditions are met. Add the terms to the where-clause object. */
    assert( p->pLimit->op==TK_LIMIT );
    if( p->iOffset!=0 && (p->selFlags & SF_Compound)==0 ){
      whereAddLimitExpr(pWC, p->iOffset, p->pLimit->pRight,
                        iCsr, SQLITE_INDEX_CONSTRAINT_OFFSET);
    }
    if( p->iOffset==0 || (p->selFlags & SF_Compound)==0 ){
      whereAddLimitExpr(pWC, p->iLimit, p->pLimit->pLeft,
                        iCsr, SQLITE_INDEX_CONSTRAINT_LIMIT);
    }
  }
}